

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

long __thiscall
asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::wait_duration_msec
          (timer_queue<asio::detail::forwarding_posix_time_traits> *this,long max_duration)

{
  pointer lhs;
  time_duration_type tVar1;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_18;
  
  lhs = (this->heap_).
        super__Vector_base<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (lhs != (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    local_18.time_.time_count_.value_ =
         (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time()
    ;
    tVar1 = boost::date_time::
            counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
            ::subtract_times((time_rep_type *)lhs,&local_18.time_);
    if ((long)tVar1.
              super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
              .ticks_.value_ < 1) {
      max_duration = 0;
    }
    else {
      if ((long)((ulong)tVar1.
                        super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                        .ticks_.value_ / 1000) < max_duration) {
        max_duration = (ulong)tVar1.
                              super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                              .ticks_.value_ / 1000;
      }
      if ((ulong)tVar1.
                 super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                 .ticks_.value_ < 1000) {
        max_duration = 1;
      }
    }
  }
  return max_duration;
}

Assistant:

virtual long wait_duration_msec(long max_duration) const
  {
    if (heap_.empty())
      return max_duration;

    return this->to_msec(
        Time_Traits::to_posix_duration(
          Time_Traits::subtract(heap_[0].time_, Time_Traits::now())),
        max_duration);
  }